

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

QString * llvmReadobjPath(QString *__return_storage_ptr__,Options *options)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  QAnyStringView QVar6;
  undefined8 local_a8;
  undefined8 uStack_a0;
  qsizetype local_98;
  undefined1 local_90 [8];
  char16_t *local_88;
  ulong local_80;
  undefined1 local_78 [8];
  char16_t *local_70;
  ulong local_68;
  undefined1 local_60 [8];
  char16_t *local_58;
  ulong local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (options->ndkPath).d.ptr;
  local_50 = (options->ndkPath).d.size | 0x8000000000000000;
  local_48 = local_60;
  local_60[0] = 1;
  local_70 = (options->toolchainPrefix).d.ptr;
  local_68 = (options->toolchainPrefix).d.size | 0x8000000000000000;
  puStack_40 = local_78;
  local_78[0] = 1;
  local_80 = (options->ndkHost).d.size | 0x8000000000000000;
  local_88 = (options->ndkHost).d.ptr;
  local_38 = local_90;
  local_90[0] = 1;
  uStack_30 = 0;
  QVar6.m_size = (size_t)"%1/toolchains/%2/prebuilt/%3/bin/llvm-readobj";
  QVar6.field_0.m_data = &local_a8;
  QtPrivate::argToQString(QVar6,0x400000000000002d,(ArgBase **)0x3);
  qVar5 = local_98;
  uVar1 = (undefined4)local_a8;
  uVar2 = local_a8._4_4_;
  uVar3 = (undefined4)uStack_a0;
  uVar4 = uStack_a0._4_4_;
  local_a8 = 0;
  uStack_a0 = 0;
  *(undefined4 *)&(__return_storage_ptr__->d).d = uVar1;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = uVar2;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = uVar3;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uVar4;
  local_98 = 0;
  (__return_storage_ptr__->d).size = qVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString llvmReadobjPath(const Options &options)
{
    return execSuffixAppended("%1/toolchains/%2/prebuilt/%3/bin/llvm-readobj"_L1
                              .arg(options.ndkPath,
                                   options.toolchainPrefix,
                                   options.ndkHost));
}